

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2polyline.cc
# Opt level: O3

bool __thiscall S2Polyline::FindValidationError(S2Polyline *this,S2Error *error)

{
  double dVar1;
  double dVar2;
  bool bVar3;
  S2Point *pSVar4;
  S2Point *pSVar5;
  long lVar6;
  char *format;
  uint uVar7;
  uint k;
  ulong uVar8;
  Code code;
  double *ap;
  undefined4 local_48;
  uint uStack_44;
  undefined4 uStack_40;
  uint uStack_3c;
  VType local_38;
  
  uVar8 = 0;
  if (0 < this->num_vertices_) {
    do {
      pSVar4 = vertex(this,(int)uVar8);
      bVar3 = S2::IsUnitLength(pSVar4);
      if (!bVar3) {
        S2Error::Init(error,NOT_UNIT_LENGTH,"Vertex %d is not unit length",uVar8);
        goto LAB_0020dfba;
      }
      uVar7 = (int)uVar8 + 1;
      uVar8 = (ulong)uVar7;
    } while ((int)uVar7 < this->num_vertices_);
    if (1 < this->num_vertices_) {
      uVar7 = 1;
      do {
        k = uVar7 - 1;
        pSVar4 = vertex(this,k);
        pSVar5 = vertex(this,uVar7);
        lVar6 = 0;
        do {
          dVar1 = *(double *)((long)pSVar4->c_ + lVar6);
          dVar2 = *(double *)((long)pSVar5->c_ + lVar6);
          if ((dVar1 != dVar2) || (NAN(dVar1) || NAN(dVar2))) break;
          bVar3 = lVar6 != 0x10;
          lVar6 = lVar6 + 8;
        } while (bVar3);
        if ((dVar1 == dVar2) && (!NAN(dVar1) && !NAN(dVar2))) {
          format = "Vertices %d and %d are identical";
          code = DUPLICATE_VERTICES;
LAB_0020dfae:
          S2Error::Init(error,code,format,(ulong)k,(ulong)uVar7);
LAB_0020dfba:
          uVar8 = 1;
          goto LAB_0020dfbd;
        }
        pSVar4 = vertex(this,k);
        pSVar5 = vertex(this,uVar7);
        local_48 = *(undefined4 *)pSVar5->c_;
        uStack_44 = *(uint *)((long)pSVar5->c_ + 4) ^ 0x80000000;
        uStack_40 = *(undefined4 *)(pSVar5->c_ + 1);
        uStack_3c = *(uint *)((long)pSVar5->c_ + 0xc) ^ 0x80000000;
        local_38 = -pSVar5->c_[2];
        lVar6 = 0;
        do {
          dVar1 = *(double *)((long)pSVar4->c_ + lVar6);
          dVar2 = *(double *)((long)&local_48 + lVar6);
          if ((dVar1 != dVar2) || (NAN(dVar1) || NAN(dVar2))) break;
          bVar3 = lVar6 != 0x10;
          lVar6 = lVar6 + 8;
        } while (bVar3);
        if ((dVar1 == dVar2) && (!NAN(dVar1) && !NAN(dVar2))) {
          format = "Vertices %d and %d are antipodal";
          code = ANTIPODAL_VERTICES;
          goto LAB_0020dfae;
        }
        uVar7 = uVar7 + 1;
      } while ((int)uVar7 < this->num_vertices_);
    }
    uVar8 = 0;
  }
LAB_0020dfbd:
  return SUB81(uVar8,0);
}

Assistant:

bool S2Polyline::FindValidationError(S2Error* error) const {
  // All vertices must be unit length.
  for (int i = 0; i < num_vertices(); ++i) {
    if (!S2::IsUnitLength(vertex(i))) {
      error->Init(S2Error::NOT_UNIT_LENGTH, "Vertex %d is not unit length", i);
      return true;
    }
  }
  // Adjacent vertices must not be identical or antipodal.
  for (int i = 1; i < num_vertices(); ++i) {
    if (vertex(i - 1) == vertex(i)) {
      error->Init(S2Error::DUPLICATE_VERTICES,
                  "Vertices %d and %d are identical", i - 1, i);
      return true;
    }
    if (vertex(i - 1) == -vertex(i)) {
      error->Init(S2Error::ANTIPODAL_VERTICES,
                  "Vertices %d and %d are antipodal", i - 1, i);
      return true;
    }
  }
  return false;
}